

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook>::disposeImpl
          (HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook> *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<capnp::(anonymous_namespace)::MembraneRequestHook> *this_local;
  
  if (pointer != (void *)0x0) {
    ::capnp::anon_unknown_0::MembraneRequestHook::~MembraneRequestHook
              ((MembraneRequestHook *)pointer);
    operator_delete(pointer,0x58);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }